

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinputsimulatorimpllinux.cpp
# Opt level: O0

void __thiscall XInputSimulatorImplLinux::mouseScrollY(XInputSimulatorImplLinux *this,int length)

{
  int local_1c;
  uint local_18;
  int cnt;
  int button;
  int length_local;
  XInputSimulatorImplLinux *this_local;
  
  if (length < 0) {
    local_18 = 4;
  }
  else {
    local_18 = 5;
  }
  cnt = length;
  if (length < 0) {
    cnt = -length;
  }
  for (local_1c = 0; local_1c < cnt; local_1c = local_1c + 1) {
    (*(this->super_XInputSimulatorImpl)._vptr_XInputSimulatorImpl[4])(this,(ulong)local_18);
    (*(this->super_XInputSimulatorImpl)._vptr_XInputSimulatorImpl[5])(this,(ulong)local_18);
  }
  return;
}

Assistant:

void XInputSimulatorImplLinux::mouseScrollY(int length)
{
    int button;
    if(length < 0){
        button = 4;  //scroll up button
    }else{
        button = 5;  //scroll down button
    }

    if(length < 0){
        length *= -1;
    }

    for(int cnt = 0; cnt < length; cnt++){
        this->mouseDown(button);
        this->mouseUp(button);
    }
}